

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

void __thiscall
pybind11::detail::value_and_holder::set_holder_constructed(value_and_holder *this,bool v)

{
  instance *piVar1;
  uint8_t *puVar2;
  byte bVar3;
  
  piVar1 = this->inst;
  if ((piVar1->field_0x30 & 2) == 0) {
    puVar2 = (piVar1->field_1).nonsimple.status;
    bVar3 = puVar2[this->index];
    if (v) {
      bVar3 = bVar3 | 1;
    }
    else {
      bVar3 = bVar3 & 0xfe;
    }
    puVar2[this->index] = bVar3;
  }
  else {
    piVar1->field_0x30 = piVar1->field_0x30 & 0xfb | v << 2;
  }
  return;
}

Assistant:

void set_holder_constructed(bool v = true) {
        if (inst->simple_layout)
            inst->simple_holder_constructed = v;
        else if (v)
            inst->nonsimple.status[index] |= instance::status_holder_constructed;
        else
            inst->nonsimple.status[index] &= (std::uint8_t) ~instance::status_holder_constructed;
    }